

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qparallelanimationgroup.cpp
# Opt level: O0

void __thiscall
QParallelAnimationGroupPrivate::_q_uncontrolledAnimationFinished
          (QParallelAnimationGroupPrivate *this)

{
  bool bVar1;
  int iVar2;
  QObject *this_00;
  QAbstractAnimation *this_01;
  QAbstractAnimation **ppQVar3;
  int *piVar4;
  QParallelAnimationGroupPrivate *in_RDI;
  long in_FS_OFFSET;
  int uncontrolledRunningCount;
  QAbstractAnimation *animation;
  QParallelAnimationGroup *q;
  AnimationListConstIt cend_1;
  AnimationListConstIt it_1;
  int maxDuration;
  AnimationTimeHashIt cend;
  AnimationTimeHashIt it;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff90;
  int iVar5;
  int local_4c;
  QAbstractAnimation **local_48;
  const_iterator local_40;
  const_iterator local_38;
  int local_2c;
  piter local_28;
  piter local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QObject *)q_func(in_RDI);
  QObject::sender(this_00);
  this_01 = qobject_cast<QAbstractAnimation*>((QObject *)0x67d697);
  iVar5 = 0;
  iVar2 = (*(this_01->super_QObject)._vptr_QObject[0xc])();
  if ((iVar2 == -1) ||
     (iVar2 = QAbstractAnimation::loopCount
                        ((QAbstractAnimation *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)), iVar2 < 0))
  {
    local_18.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_18.d = (Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_> *)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = (piter)QHash<QAbstractAnimation_*,_int>::begin
                                ((QHash<QAbstractAnimation_*,_int> *)this_01);
    local_28.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_28.d = (Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_> *)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = (piter)QHash<QAbstractAnimation_*,_int>::end
                                ((QHash<QAbstractAnimation_*,_int> *)in_RDI);
    while (bVar1 = QHash<QAbstractAnimation_*,_int>::iterator::operator!=
                             ((iterator *)in_RDI,
                              (iterator *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)), bVar1)
    {
      ppQVar3 = QHash<QAbstractAnimation_*,_int>::iterator::key((iterator *)0x67d74c);
      if (*ppQVar3 == this_01) {
        in_stack_ffffffffffffff84 =
             QAbstractAnimation::currentTime
                       ((QAbstractAnimation *)
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        piVar4 = QHash<QAbstractAnimation_*,_int>::iterator::operator*((iterator *)0x67d76e);
        *piVar4 = in_stack_ffffffffffffff84;
      }
      piVar4 = QHash<QAbstractAnimation_*,_int>::iterator::value((iterator *)0x67d77e);
      if (*piVar4 == -1) {
        iVar5 = iVar5 + 1;
      }
      QHash<QAbstractAnimation_*,_int>::iterator::operator++
                ((iterator *)CONCAT44(iVar5,in_stack_ffffffffffffff90));
    }
  }
  if (iVar5 < 1) {
    local_2c = 0;
    local_38.i = (QAbstractAnimation **)&DAT_aaaaaaaaaaaaaaaa;
    local_38 = QList<QAbstractAnimation_*>::constBegin
                         ((QList<QAbstractAnimation_*> *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    local_40.i = (QAbstractAnimation **)&DAT_aaaaaaaaaaaaaaaa;
    local_40 = QList<QAbstractAnimation_*>::constEnd
                         ((QList<QAbstractAnimation_*> *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    while( true ) {
      local_48 = local_40.i;
      bVar1 = QList<QAbstractAnimation_*>::const_iterator::operator!=(&local_38,local_40);
      if (!bVar1) break;
      QList<QAbstractAnimation_*>::const_iterator::operator*(&local_38);
      local_4c = QAbstractAnimation::totalDuration((QAbstractAnimation *)in_RDI);
      piVar4 = qMax<int>(&local_2c,&local_4c);
      local_2c = *piVar4;
      QList<QAbstractAnimation_*>::const_iterator::operator++(&local_38);
    }
    if (local_2c <=
        (in_RDI->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime) {
      QAbstractAnimation::stop
                ((QAbstractAnimation *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                );
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QParallelAnimationGroupPrivate::_q_uncontrolledAnimationFinished()
{
    Q_Q(QParallelAnimationGroup);

    QAbstractAnimation *animation = qobject_cast<QAbstractAnimation *>(q->sender());
    Q_ASSERT(animation);

    int uncontrolledRunningCount = 0;
    if (animation->duration() == -1 || animation->loopCount() < 0) {
        for (AnimationTimeHashIt it = uncontrolledFinishTime.begin(), cend = uncontrolledFinishTime.end(); it != cend; ++it) {
            if (it.key() == animation) {
                *it = animation->currentTime();
            }
            if (it.value() == -1)
                ++uncontrolledRunningCount;
        }
    }

    if (uncontrolledRunningCount > 0)
        return;

    int maxDuration = 0;
    for (AnimationListConstIt it = animations.constBegin(), cend = animations.constEnd(); it != cend; ++it)
        maxDuration = qMax(maxDuration, (*it)->totalDuration());

    if (currentTime >= maxDuration)
        q->stop();
}